

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::ProcessDirectory
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *passed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *failed)

{
  size_t *__return_storage_ptr__;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  ostream *poVar5;
  time_t tVar6;
  reference pcVar7;
  reference __rhs;
  pointer pcVar8;
  mapped_type *this_00;
  mapped_type *ppcVar9;
  double dVar10;
  double dVar11;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar12;
  cmCTestBatchTestHandler *local_200;
  string local_1e0;
  string local_1c0;
  _Base_ptr local_1a0;
  undefined1 local_198;
  __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
  local_190;
  __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
  local_188;
  iterator it2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  iterator i;
  TestSet depends;
  cmCTestTestProperties *p;
  __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
  local_130;
  iterator it;
  undefined1 local_100 [7];
  bool randomSchedule;
  PropertiesMap properties;
  TestMap tests;
  cmCTestMultiProcessHandler *parallel;
  double elapsed_time_start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *failed_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *passed_local;
  cmCTestTestHandler *this_local;
  
  local_20 = failed;
  failed_local = passed;
  passed_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  ComputeTestList(this);
  cmCTest::CurrentTime_abi_cxx11_
            ((string *)&elapsed_time_start,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::operator=((string *)&this->StartTest,(string *)&elapsed_time_start);
  std::__cxx11::string::~string((string *)&elapsed_time_start);
  dVar10 = cmsys::SystemTools::GetTime();
  this->StartTestTime = (uint)(long)dVar10;
  dVar10 = cmsys::SystemTools::GetTime();
  bVar1 = cmCTest::GetBatchJobs((this->super_cmCTestGenericHandler).CTest);
  if (bVar1) {
    local_200 = (cmCTestBatchTestHandler *)operator_new(0x200);
    cmCTestBatchTestHandler::cmCTestBatchTestHandler(local_200);
  }
  else {
    local_200 = (cmCTestBatchTestHandler *)operator_new(0x1e0);
    cmCTestMultiProcessHandler::cmCTestMultiProcessHandler((cmCTestMultiProcessHandler *)local_200);
  }
  cmCTestMultiProcessHandler::SetCTest
            (&local_200->super_cmCTestMultiProcessHandler,(this->super_cmCTestGenericHandler).CTest)
  ;
  iVar4 = cmCTest::GetParallelLevel((this->super_cmCTestGenericHandler).CTest);
  cmCTestMultiProcessHandler::SetParallelLevel
            (&local_200->super_cmCTestMultiProcessHandler,(long)iVar4);
  cmCTestMultiProcessHandler::SetTestHandler(&local_200->super_cmCTestMultiProcessHandler,this);
  cmCTestMultiProcessHandler::SetQuiet
            (&local_200->super_cmCTestMultiProcessHandler,
             (bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  poVar5 = std::operator<<(this->LogFile,"Start testing: ");
  __return_storage_ptr__ =
       &tests.
        super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  cmCTest::CurrentTime_abi_cxx11_
            ((string *)__return_storage_ptr__,(this->super_cmCTestGenericHandler).CTest);
  poVar5 = std::operator<<(poVar5,(string *)__return_storage_ptr__);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"----------------------------------------------------------");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             &tests.
              super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmCTestMultiProcessHandler::TestMap::TestMap
            ((TestMap *)
             &properties.
              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmCTestMultiProcessHandler::PropertiesMap::PropertiesMap((PropertiesMap *)local_100);
  cmCTest::GetScheduleType_abi_cxx11_((string *)&it,(this->super_cmCTestGenericHandler).CTest);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                          "Random");
  std::__cxx11::string::~string((string *)&it);
  if (bVar1) {
    tVar6 = time((time_t *)0x0);
    srand((uint)tVar6);
  }
  local_130._M_current =
       (cmCTestTestProperties *)
       std::
       vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
       ::begin(&this->TestList);
  do {
    p = (cmCTestTestProperties *)
        std::
        vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
        ::end(&this->TestList);
    bVar2 = __gnu_cxx::operator!=
                      (&local_130,
                       (__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                        *)&p);
    if (!bVar2) {
      cmCTestMultiProcessHandler::SetTests
                (&local_200->super_cmCTestMultiProcessHandler,
                 (TestMap *)
                 &properties.
                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_node_count,(PropertiesMap *)local_100);
      cmCTestMultiProcessHandler::SetPassFailVectors
                (&local_200->super_cmCTestMultiProcessHandler,failed_local,local_20);
      std::
      vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      ::clear(&this->TestResults);
      cmCTestMultiProcessHandler::SetTestResults
                (&local_200->super_cmCTestMultiProcessHandler,&this->TestResults);
      bVar1 = cmCTest::ShouldPrintLabels((this->super_cmCTestGenericHandler).CTest);
      if (bVar1) {
        cmCTestMultiProcessHandler::PrintLabels(&local_200->super_cmCTestMultiProcessHandler);
      }
      else {
        bVar1 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar1) {
          cmCTestMultiProcessHandler::PrintTestList(&local_200->super_cmCTestMultiProcessHandler);
        }
        else {
          (*(local_200->super_cmCTestMultiProcessHandler)._vptr_cmCTestMultiProcessHandler[2])();
        }
      }
      if (local_200 != (cmCTestBatchTestHandler *)0x0) {
        (*(local_200->super_cmCTestMultiProcessHandler)._vptr_cmCTestMultiProcessHandler[1])();
      }
      cmCTest::CurrentTime_abi_cxx11_(&local_1c0,(this->super_cmCTestGenericHandler).CTest);
      std::__cxx11::string::operator=((string *)&this->EndTest,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      dVar11 = cmsys::SystemTools::GetTime();
      this->EndTestTime = (uint)(long)dVar11;
      dVar11 = cmsys::SystemTools::GetTime();
      this->ElapsedTestingTime = dVar11 - dVar10;
      poVar5 = std::operator<<(this->LogFile,"End testing: ");
      cmCTest::CurrentTime_abi_cxx11_(&local_1e0,(this->super_cmCTestGenericHandler).CTest);
      poVar5 = std::operator<<(poVar5,(string *)&local_1e0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_1e0);
      cmCTestMultiProcessHandler::PropertiesMap::~PropertiesMap((PropertiesMap *)local_100);
      cmCTestMultiProcessHandler::TestMap::~TestMap
                ((TestMap *)
                 &properties.
                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    pcVar7 = __gnu_cxx::
             __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
             ::operator*(&local_130);
    cmCTestMultiProcessHandler::TestSet::TestSet((TestSet *)&i);
    if (bVar1) {
      iVar4 = rand();
      pcVar7->Cost = (float)iVar4;
    }
    if ((pcVar7->Timeout == 0.0) && (!NAN(pcVar7->Timeout))) {
      dVar11 = cmCTest::GetGlobalTimeout((this->super_cmCTestGenericHandler).CTest);
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        dVar11 = cmCTest::GetGlobalTimeout((this->super_cmCTestGenericHandler).CTest);
        pcVar7->Timeout = dVar11;
      }
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pcVar7->Depends);
    if (!bVar2) {
      local_178._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pcVar7->Depends);
      while( true ) {
        it2._M_current =
             (cmCTestTestProperties *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pcVar7->Depends);
        bVar2 = __gnu_cxx::operator!=
                          (&local_178,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&it2);
        if (!bVar2) break;
        local_188._M_current =
             (cmCTestTestProperties *)
             std::
             vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ::begin(&this->TestList);
        while( true ) {
          local_190._M_current =
               (cmCTestTestProperties *)
               std::
               vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ::end(&this->TestList);
          bVar2 = __gnu_cxx::operator!=(&local_188,&local_190);
          if (!bVar2) break;
          pcVar8 = __gnu_cxx::
                   __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                   ::operator->(&local_188);
          __rhs = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_178);
          _Var3 = std::operator==(&pcVar8->Name,__rhs);
          if (_Var3) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
                     ::operator->(&local_188);
            pVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,&pcVar8->Index)
            ;
            local_1a0 = (_Base_ptr)pVar12.first._M_node;
            local_198 = pVar12.second;
            break;
          }
          __gnu_cxx::
          __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
          ::operator++(&local_188);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_178);
      }
    }
    pcVar8 = __gnu_cxx::
             __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
             ::operator->(&local_130);
    this_00 = std::
              map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ::operator[]((map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                            *)&properties.
                               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ._M_t._M_impl.super__Rb_tree_header._M_node_count,&pcVar8->Index);
    cmCTestMultiProcessHandler::TestSet::operator=(this_00,(TestSet *)&i);
    pcVar7 = __gnu_cxx::
             __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
             ::operator*(&local_130);
    pcVar8 = __gnu_cxx::
             __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
             ::operator->(&local_130);
    ppcVar9 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[]((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                            *)local_100,&pcVar8->Index);
    *ppcVar9 = pcVar7;
    cmCTestMultiProcessHandler::TestSet::~TestSet((TestSet *)&i);
    __gnu_cxx::
    __normal_iterator<cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
    ::operator++(&local_130);
  } while( true );
}

Assistant:

void cmCTestTestHandler::ProcessDirectory(std::vector<std::string> &passed,
                                         std::vector<std::string> &failed)
{
  this->ComputeTestList();
  this->StartTest = this->CTest->CurrentTime();
  this->StartTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  double elapsed_time_start = cmSystemTools::GetTime();

  cmCTestMultiProcessHandler* parallel = this->CTest->GetBatchJobs() ?
    new cmCTestBatchTestHandler : new cmCTestMultiProcessHandler;
  parallel->SetCTest(this->CTest);
  parallel->SetParallelLevel(this->CTest->GetParallelLevel());
  parallel->SetTestHandler(this);
  parallel->SetQuiet(this->Quiet);

  *this->LogFile << "Start testing: "
    << this->CTest->CurrentTime() << std::endl
    << "----------------------------------------------------------"
    << std::endl;

  cmCTestMultiProcessHandler::TestMap tests;
  cmCTestMultiProcessHandler::PropertiesMap properties;

  bool randomSchedule = this->CTest->GetScheduleType() == "Random";
  if(randomSchedule)
    {
    srand((unsigned)time(0));
    }

  for (ListOfTests::iterator it = this->TestList.begin();
       it != this->TestList.end(); ++it)
    {
    cmCTestTestProperties& p = *it;
    cmCTestMultiProcessHandler::TestSet depends;

    if(randomSchedule)
      {
      p.Cost = static_cast<float>(rand());
      }

    if(p.Timeout == 0 && this->CTest->GetGlobalTimeout() != 0)
      {
      p.Timeout = this->CTest->GetGlobalTimeout();
      }

    if(!p.Depends.empty())
      {
      for(std::vector<std::string>::iterator i = p.Depends.begin();
          i != p.Depends.end(); ++i)
        {
        for(ListOfTests::iterator it2 = this->TestList.begin();
            it2 != this->TestList.end(); ++it2)
          {
          if(it2->Name == *i)
            {
            depends.insert(it2->Index);
            break; // break out of test loop as name can only match 1
            }
          }
        }
      }
    tests[it->Index] = depends;
    properties[it->Index] = &*it;
    }
  parallel->SetTests(tests, properties);
  parallel->SetPassFailVectors(&passed, &failed);
  this->TestResults.clear();
  parallel->SetTestResults(&this->TestResults);

  if(this->CTest->ShouldPrintLabels())
    {
    parallel->PrintLabels();
    }
  else if(this->CTest->GetShowOnly())
    {
    parallel->PrintTestList();
    }
  else
    {
    parallel->RunTests();
    }
  delete parallel;
  this->EndTest = this->CTest->CurrentTime();
  this->EndTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  this->ElapsedTestingTime = cmSystemTools::GetTime() - elapsed_time_start;
  *this->LogFile << "End testing: "
     << this->CTest->CurrentTime() << std::endl;
}